

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O2

_Bool effect_handler_TAP_DEVICE(effect_handler_context_t_conflict *context)

{
  uint32_t *puVar1;
  byte *pbVar2;
  short sVar3;
  player_upkeep *ppVar4;
  player *ppVar5;
  _Bool _Var6;
  wchar_t wVar7;
  uint32_t uVar8;
  ulong uVar9;
  byte can_disturb;
  int iVar10;
  char *pcVar11;
  short sVar12;
  object *obj;
  
  if (context->cmd == (command *)0x0) {
    _Var6 = get_item(&obj,"Drain charges from which item? ",
                     "You have nothing to drain charges from.",CMD_NULL,tval_can_have_charges,
                     L'\x06');
    if (!_Var6) {
      return false;
    }
  }
  else {
    wVar7 = cmd_get_item((command_conflict *)context->cmd,"tgtitem",&obj,
                         "Drain charges from which item? ","You have nothing to drain charges from."
                         ,tval_can_have_charges,L'\x06');
    if (wVar7 != L'\0') {
      return false;
    }
  }
  wVar7 = obj->kind->level;
  _Var6 = tval_is_staff(obj);
  if (_Var6) {
    pcVar11 = "Use a staff";
  }
  else {
    _Var6 = tval_is_wand(obj);
    if (!_Var6) {
      pcVar11 = "";
      goto LAB_0013fd53;
    }
    pcVar11 = "Aim a wand";
  }
  ppVar5 = player;
  pcVar11 = pcVar11 + 6;
  iVar10 = (int)obj->pval * (wVar7 * 3 + 0xf);
  uVar9 = (long)iVar10 / 2 & 0xffffffff;
  if (0x47 < iVar10) {
    sVar3 = player->msp;
    sVar12 = player->csp;
    if (sVar12 < sVar3) {
      obj->pval = 0;
      ppVar4 = ppVar5->upkeep;
      puVar1 = &ppVar4->notice;
      *puVar1 = *puVar1 | 1;
      pbVar2 = (byte *)((long)&ppVar4->redraw + 2);
      *pbVar2 = *pbVar2 | 2;
      sVar12 = sVar12 + (short)(uVar9 / 6);
      ppVar5->csp = sVar12;
      ppVar5->csp_frac = 0;
      if (sVar3 < sVar12) {
        ppVar5->csp = sVar3;
      }
      msg("You feel your head clear.",6,uVar9 % 6);
      ppVar5 = player;
      uVar8 = Rand_div(2);
      can_disturb = true;
      if ((context->origin).what == SRC_PLAYER) {
        can_disturb = context->aware ^ 1;
      }
      player_inc_timed(ppVar5,L'\t',uVar8 + L'\x01',true,(_Bool)can_disturb,true);
      puVar1 = &player->upkeep->redraw;
      *puVar1 = *puVar1 | 0x80;
      return true;
    }
    pcVar11 = string_make(pcVar11);
    my_strcap(pcVar11);
    msg("Your mana was already at its maximum.  %s not drained.",pcVar11);
    string_free(pcVar11);
    return false;
  }
LAB_0013fd53:
  msg("That %s had no useable energy",pcVar11);
  return false;
}

Assistant:

bool effect_handler_TAP_DEVICE(effect_handler_context_t *context)
{
	int lev;
	int energy = 0;
	struct object *obj;
	bool used = false;
	int itemmode = (USE_INVEN | USE_FLOOR);
	const char *q, *s;
	const char *item = "";

	/* Get an item */
	q = "Drain charges from which item? ";
	s = "You have nothing to drain charges from.";
	if (context->cmd) {
		if (cmd_get_item(context->cmd, "tgtitem", &obj, q, s,
				tval_can_have_charges, itemmode)) {
			return used;
		}
	} else if (!get_item(&obj, q, s, 0, tval_can_have_charges, itemmode)) {
		return (used);
	}

	/* Extract the object "level" */
	lev = obj->kind->level;

	/* Extract the object's energy and get its generic name. */
	if (tval_is_staff(obj)) {
		energy = (5 + lev) * 3 * obj->pval / 2;
		item = "staff";
	} else if (tval_is_wand(obj)) {
		energy = (5 + lev) * 3 * obj->pval / 2;
		item = "wand";
	}

	/* Turn energy into mana. */
	if (energy < 36) {
		/* Require a resonable amount of energy */
		msg("That %s had no useable energy", item);
	} else {
		/* If mana below maximum, increase mana and drain object. */
		if (player->csp < player->msp) {
			/* Drain the object. */
			obj->pval = 0;


			/* Combine / Reorder the pack (later) */
			player->upkeep->notice |= (PN_COMBINE);

			/* Redraw stuff */
			player->upkeep->redraw |= (PR_INVEN);

			/* Increase mana. */
			player->csp += energy / 6;
			player->csp_frac = 0;
			if (player->csp > player->msp) {
				(player->csp = player->msp);
			}

			msg("You feel your head clear.");
			used = true;
			player_inc_timed(player, TMD_STUN, randint1(2), true,
				context->origin.what != SRC_PLAYER
				|| !context->aware, true);

			player->upkeep->redraw |= (PR_MANA);
		} else {
			char *cap = string_make(item);
			my_strcap(cap);
			msg("Your mana was already at its maximum.  %s not drained.", cap);
			string_free(cap);
		}
	}

	return (used);
}